

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

uint64 __thiscall google::protobuf::internal::ArenaImpl::SpaceUsed(ArenaImpl *this)

{
  uint64 uVar1;
  uint64 uVar2;
  __pointer_type this_00;
  
  uVar2 = 0;
  for (this_00 = (this->threads_)._M_b._M_p; this_00 != (SerialArena *)0x0; this_00 = this_00->next_
      ) {
    uVar1 = SerialArena::SpaceUsed(this_00);
    uVar2 = uVar2 + uVar1;
  }
  return uVar2;
}

Assistant:

uint64 ArenaImpl::SpaceUsed() const {
  SerialArena* serial = threads_.load(std::memory_order_acquire);
  uint64 space_used = 0;
  for (; serial; serial = serial->next()) {
    space_used += serial->SpaceUsed();
  }
  return space_used;
}